

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es32cRobustBufferAccessBehaviorTests.cpp
# Opt level: O0

bool __thiscall
es32cts::RobustBufferAccessBehavior::UniformBufferTest::verifyResults
          (UniformBufferTest *this,GLfloat *buffer_data)

{
  VERSION VVar1;
  int iVar2;
  TestError *this_00;
  TestContext *this_01;
  TestLog *this_02;
  MessageBuilder *pMVar3;
  MessageBuilder local_1c8;
  char *local_38;
  GLchar *name;
  GLfloat *expected_data;
  GLfloat *pGStack_20;
  int size;
  GLfloat *buffer_data_local;
  UniformBufferTest *this_local;
  
  expected_data._4_4_ = 0x10;
  name = (GLchar *)0x0;
  local_38 = (char *)0x0;
  VVar1 = (this->super_UniformBufferTest).m_test_case;
  pGStack_20 = buffer_data;
  buffer_data_local = (GLfloat *)this;
  if (VVar1 == VALID) {
    name = "";
    local_38 = "valid indices";
  }
  else {
    if (VVar1 != SOURCE_INVALID) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles32/es32cRobustBufferAccessBehaviorTests.cpp"
                 ,0x54b);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    name = "";
    local_38 = "invalid source indices";
  }
  if (((this->super_UniformBufferTest).m_test_case == VALID) &&
     (iVar2 = memcmp(name,buffer_data,0x10), iVar2 != 0)) {
    this_01 = deqp::Context::getTestContext
                        ((this->super_UniformBufferTest).super_TestCase.m_context);
    this_02 = tcu::TestContext::getLog(this_01);
    tcu::TestLog::operator<<(&local_1c8,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_1c8,(char (*) [12])0x29c1d9f);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_38);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [8])0x2b1ddcc);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c8);
    return false;
  }
  return true;
}

Assistant:

bool UniformBufferTest::verifyResults(GLfloat* buffer_data)
{
	static const GLfloat expected_data_valid[4]			 = { 2.0f, 3.0f, 4.0f, 5.0f };
	static const GLfloat expected_data_invalid_source[4] = { 0.0f, 0.0f, 0.0f, 0.0f };

	int size = sizeof(GLfloat) * 4;

	/* Prepare expected data const for proper case*/
	const GLfloat* expected_data = 0;
	const GLchar*  name			 = 0;
	switch (m_test_case)
	{
	case VALID:
		expected_data = expected_data_valid;
		name		  = "valid indices";
		break;
	case SOURCE_INVALID:
		expected_data = expected_data_invalid_source;
		name		  = "invalid source indices";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	/* Verify buffer data */
	if (m_test_case == VALID && memcmp(expected_data, buffer_data, size) != 0)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << name << " failed"
											<< tcu::TestLog::EndMessage;
		return false;
	}

	return true;
}